

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall duckdb_parquet::PageHeader::PageHeader(PageHeader *this)

{
  _DictionaryPageHeader__isset *p_Var1;
  
  *(undefined ***)this = &PTR__PageHeader_0247db70;
  this->type = DATA_PAGE;
  this->uncompressed_page_size = 0;
  this->compressed_page_size = 0;
  this->crc = 0;
  DataPageHeader::DataPageHeader(&this->data_page_header);
  this->index_page_header = (IndexPageHeader)&PTR__IndexPageHeader_0247d760;
  *(undefined ***)&this->dictionary_page_header = &PTR__DictionaryPageHeader_0247d7c8;
  (this->dictionary_page_header).num_values = 0;
  (this->dictionary_page_header).encoding = PLAIN;
  (this->dictionary_page_header).is_sorted = false;
  p_Var1 = &(this->dictionary_page_header).__isset;
  *p_Var1 = (_DictionaryPageHeader__isset)((byte)*p_Var1 & 0xfe);
  DataPageHeaderV2::DataPageHeaderV2(&this->data_page_header_v2);
  this->__isset = (_PageHeader__isset)((byte)this->__isset & 0xe0);
  return;
}

Assistant:

PageHeader::PageHeader() noexcept
   : type(static_cast<PageType::type>(0)),
     uncompressed_page_size(0),
     compressed_page_size(0),
     crc(0) {
}